

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generator.cc
# Opt level: O2

void __thiscall pass_replace_Test::TestBody(pass_replace_Test *this)

{
  bool bVar1;
  Generator *this_00;
  Port *pPVar2;
  Port *var;
  Port *pPVar3;
  Generator *this_01;
  Generator *this_02;
  Generator *this_03;
  mapped_type *pmVar4;
  long lVar5;
  Generator *top;
  char *message;
  char *in_R9;
  undefined1 local_250 [8];
  Context c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_128;
  shared_ptr<kratos::Stmt> local_120;
  shared_ptr<kratos::Stmt> local_110;
  shared_ptr<kratos::Stmt> local_100;
  Port *local_f0;
  Port *local_e8;
  Port *local_e0;
  allocator<char> local_d8 [8];
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  AssertHelper local_b0;
  key_type local_a8;
  Generator *local_88;
  undefined1 local_80 [8];
  mapped_type src;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_src;
  
  kratos::Context::Context((Context *)local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"module1",(allocator<char> *)local_80);
  this_00 = kratos::Context::generator((Context *)local_250,(string *)((long)&src.field_2 + 8));
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"in",(allocator<char> *)local_80);
  kratos::Generator::port(this_00,In,(string *)((long)&src.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"out",(allocator<char> *)local_80);
  pPVar2 = kratos::Generator::port(this_00,Out,(string *)((long)&src.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"module2",(allocator<char> *)local_80);
  local_88 = kratos::Context::generator((Context *)local_250,(string *)((long)&src.field_2 + 8));
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"in",(allocator<char> *)local_80);
  var = kratos::Generator::port(local_88,In,(string *)((long)&src.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"out",(allocator<char> *)local_80);
  pPVar3 = kratos::Generator::port(local_88,Out,(string *)((long)&src.field_2 + 8),1);
  local_f0 = pPVar2;
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  kratos::Var::assign((Var *)((long)&src.field_2 + 8),&pPVar3->super_Var);
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)src.field_2._8_8_;
  _Stack_128._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod_src._M_t._M_impl._0_8_;
  src.field_2._8_8_ = 0;
  mod_src._M_t._M_impl._0_8_ = 0;
  kratos::Generator::add_stmt
            (local_88,(shared_ptr<kratos::Stmt> *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mod_src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"module3",(allocator<char> *)local_80);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kratos::Context::generator((Context *)local_250,(string *)((long)&src.field_2 + 8));
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"in",(allocator<char> *)local_80);
  pPVar2 = kratos::Generator::port
                     ((Generator *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,In,(string *)((long)&src.field_2 + 8),2);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"out",(allocator<char> *)local_80);
  pPVar3 = kratos::Generator::port
                     ((Generator *)
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,Out,(string *)((long)&src.field_2 + 8),2);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  local_e8 = pPVar2;
  local_e0 = pPVar3;
  kratos::Var::assign((Var *)((long)&src.field_2 + 8),&pPVar3->super_Var);
  local_120.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)src.field_2._8_8_;
  local_120.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod_src._M_t._M_impl._0_8_;
  src.field_2._8_8_ = 0;
  mod_src._M_t._M_impl._0_8_ = 0;
  kratos::Generator::add_stmt
            ((Generator *)
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,&local_120);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_120.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mod_src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"module4",(allocator<char> *)local_80);
  this_01 = kratos::Context::generator((Context *)local_250,(string *)((long)&src.field_2 + 8));
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"in",(allocator<char> *)local_80);
  kratos::Generator::port(this_01,In,(string *)((long)&src.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"out",(allocator<char> *)local_80);
  kratos::Generator::port(this_01,Out,(string *)((long)&src.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"out2",(allocator<char> *)local_80);
  kratos::Generator::port(this_01,Out,(string *)((long)&src.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"inst0",(allocator<char> *)&local_a8);
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_80,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &local_88->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            (this_00,(string *)((long)&src.field_2 + 8),(shared_ptr<kratos::Generator> *)local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  kratos::Var::assign((Var *)((long)&src.field_2 + 8),&var->super_Var);
  local_110.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)src.field_2._8_8_;
  local_110.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod_src._M_t._M_impl._0_8_;
  src.field_2._8_8_ = 0;
  mod_src._M_t._M_impl._0_8_ = 0;
  kratos::Generator::add_stmt(this_00,&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_110.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mod_src);
  kratos::Var::assign((Var *)((long)&src.field_2 + 8),&local_f0->super_Var);
  local_100.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)src.field_2._8_8_;
  local_100.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod_src._M_t._M_impl._0_8_;
  src.field_2._8_8_ = 0;
  mod_src._M_t._M_impl._0_8_ = 0;
  kratos::Generator::add_stmt(this_00,&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_100.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mod_src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"module5",(allocator<char> *)local_80);
  this_02 = kratos::Context::generator((Context *)local_250,(string *)((long)&src.field_2 + 8));
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"in",(allocator<char> *)local_80);
  kratos::Generator::port(this_02,Out,(string *)((long)&src.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"out",(allocator<char> *)local_80);
  kratos::Generator::port(this_02,Out,(string *)((long)&src.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"module6",(allocator<char> *)local_80);
  this_03 = kratos::Context::generator((Context *)local_250,(string *)((long)&src.field_2 + 8));
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"in",(allocator<char> *)local_80);
  kratos::Generator::port(this_03,In,(string *)((long)&src.field_2 + 8),1,Clock);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src.field_2._M_local_buf + 8),"out",(allocator<char> *)local_80);
  kratos::Generator::port(this_03,Out,(string *)((long)&src.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  src.field_2._8_8_ = &mod_src._M_t._M_impl.super__Rb_tree_header;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mod_src._M_t._M_impl._0_8_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_80,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x68));
    kratos::Generator::replace
              (this_00,&local_88->instance_name,(shared_ptr<kratos::Generator> *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  }
  std::__cxx11::string::assign(src.field_2._M_local_buf + 8);
  testing::Message::Message((Message *)local_80);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
             ,0x8b,(char *)src.field_2._8_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_80);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
  if (local_80 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_80 + 8))();
  }
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  src.field_2._8_8_ = &mod_src._M_t._M_impl.super__Rb_tree_header;
  mod_src._M_t._M_impl._0_8_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_80,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &this_01->super_enable_shared_from_this<kratos::Generator>);
    kratos::Generator::replace
              (this_00,&local_88->instance_name,(shared_ptr<kratos::Generator> *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  }
  std::__cxx11::string::assign(src.field_2._M_local_buf + 8);
  testing::Message::Message((Message *)local_80);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
             ,0x8c,(char *)src.field_2._8_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_80);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
  if (local_80 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_80 + 8))();
  }
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  src.field_2._8_8_ = &mod_src._M_t._M_impl.super__Rb_tree_header;
  mod_src._M_t._M_impl._0_8_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_80,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &this_02->super_enable_shared_from_this<kratos::Generator>);
    kratos::Generator::replace
              (this_00,&local_88->instance_name,(shared_ptr<kratos::Generator> *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  }
  std::__cxx11::string::assign(src.field_2._M_local_buf + 8);
  testing::Message::Message((Message *)local_80);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
             ,0x8d,(char *)src.field_2._8_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_80);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
  if (local_80 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_80 + 8))();
  }
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  src.field_2._8_8_ = &mod_src._M_t._M_impl.super__Rb_tree_header;
  mod_src._M_t._M_impl._0_8_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_80,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &this_03->super_enable_shared_from_this<kratos::Generator>);
    kratos::Generator::replace
              (this_00,&local_88->instance_name,(shared_ptr<kratos::Generator> *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  }
  std::__cxx11::string::assign(src.field_2._M_local_buf + 8);
  testing::Message::Message((Message *)local_80);
  pPVar2 = local_e0;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
             ,0x8e,(char *)src.field_2._8_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_80);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
  if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_80 !=
      (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    (**(code **)(*(long *)local_80 + 8))();
  }
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  (local_e8->super_Var).var_width_ = 1;
  (pPVar2->super_Var).var_width_ = 1;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  src.field_2._8_8_ = &mod_src._M_t._M_impl.super__Rb_tree_header;
  mod_src._M_t._M_impl._0_8_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_80,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x68));
    kratos::Generator::replace
              (this_00,&local_88->instance_name,(shared_ptr<kratos::Generator> *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  }
  std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
  local_80 = (undefined1  [8])(this_00->children_)._M_h._M_element_count;
  local_a8._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)(src.field_2._M_local_buf + 8),"mod1.get_child_generator_size()","1",
             (unsigned_long *)local_80,(int *)&local_a8);
  if (src.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_80);
    if (mod_src._M_t._M_impl._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)mod_src._M_t._M_impl._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x92,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_80 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mod_src);
  kratos::fix_assignment_type(this_00);
  kratos::create_module_instantiation(this_00);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&src.field_2 + 8),(kratos *)this_00,top);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"module1",local_d8);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&src.field_2 + 8),&local_a8);
  std::__cxx11::string::string((string *)local_80,(string *)pmVar4);
  std::__cxx11::string::~string((string *)&local_a8);
  lVar5 = std::__cxx11::string::find(local_80,0x22f0b9);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_d8[0] = (allocator<char>)(lVar5 == -1);
  if (!(bool)local_d8[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_d8,
               (AssertionResult *)"src.find(\"module2\") == std::string::npos","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x97,(char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                      local_a8._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  lVar5 = std::__cxx11::string::find(local_80,0x22f0c1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_d8[0] = (allocator<char>)(lVar5 != -1);
  if (!(bool)local_d8[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_d8,
               (AssertionResult *)"src.find(\"module3\") != std::string::npos","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x98,(char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                      local_a8._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_a8);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_80);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&src.field_2 + 8));
  kratos::Context::~Context((Context *)local_250);
  return;
}

Assistant:

TEST(pass, replace) {  // NOLINT
    Context c;
    auto &mod1 = c.generator("module1");
    auto &in1 = mod1.port(PortDirection::In, "in", 1);
    auto &out1 = mod1.port(PortDirection::Out, "out", 1);

    auto &mod2 = c.generator("module2");
    auto &in2 = mod2.port(PortDirection::In, "in", 1);
    auto &out2 = mod2.port(PortDirection::Out, "out", 1);
    mod2.add_stmt(out2.assign(in2));

    auto &mod3 = c.generator("module3");
    auto &in3 = mod3.port(PortDirection::In, "in", 2);
    auto &out3 = mod3.port(PortDirection::Out, "out", 2);
    mod3.add_stmt(out3.assign(in3));

    auto &mod4 = c.generator("module4");
    mod4.port(PortDirection::In, "in", 1);
    mod4.port(PortDirection::Out, "out", 1);
    mod4.port(PortDirection::Out, "out2", 1);

    mod1.add_child_generator("inst0", mod2.shared_from_this());
    mod1.add_stmt(in2.assign(in1));
    mod1.add_stmt(out1.assign(out2));

    auto &mod5 = c.generator("module5");
    mod5.port(PortDirection::Out, "in", 1);
    mod5.port(PortDirection::Out, "out", 1);

    auto &mod6 = c.generator("module6");
    mod6.port(PortDirection::In, "in", 1, PortType::Clock);
    mod6.port(PortDirection::Out, "out", 1);

    EXPECT_THROW(mod1.replace(mod2.instance_name, mod3.shared_from_this()), VarException);
    EXPECT_THROW(mod1.replace(mod2.instance_name, mod4.shared_from_this()), VarException);
    EXPECT_THROW(mod1.replace(mod2.instance_name, mod5.shared_from_this()), VarException);
    EXPECT_THROW(mod1.replace(mod2.instance_name, mod6.shared_from_this()), VarException);
    in3.var_width() = 1;
    out3.var_width() = 1;
    EXPECT_NO_THROW(mod1.replace(mod2.instance_name, mod3.shared_from_this()));
    EXPECT_EQ(mod1.get_child_generator_size(), 1);
    fix_assignment_type(&mod1);
    create_module_instantiation(&mod1);
    auto mod_src = generate_verilog(&mod1);
    auto src = mod_src["module1"];
    EXPECT_TRUE(src.find("module2") == std::string::npos);
    EXPECT_TRUE(src.find("module3") != std::string::npos);
}